

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O0

NonMaximumSuppression_PickTop * __thiscall
CoreML::Specification::NonMaximumSuppression::mutable_picktop(NonMaximumSuppression *this)

{
  bool bVar1;
  NonMaximumSuppression_PickTop *this_00;
  NonMaximumSuppression *this_local;
  
  bVar1 = has_picktop(this);
  if (!bVar1) {
    clear_SuppressionMethod(this);
    set_has_picktop(this);
    this_00 = (NonMaximumSuppression_PickTop *)operator_new(0x18);
    NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop(this_00);
    (this->SuppressionMethod_).picktop_ = this_00;
  }
  return (this->SuppressionMethod_).picktop_;
}

Assistant:

inline ::CoreML::Specification::NonMaximumSuppression_PickTop* NonMaximumSuppression::mutable_picktop() {
  if (!has_picktop()) {
    clear_SuppressionMethod();
    set_has_picktop();
    SuppressionMethod_.picktop_ = new ::CoreML::Specification::NonMaximumSuppression_PickTop;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NonMaximumSuppression.pickTop)
  return SuppressionMethod_.picktop_;
}